

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O1

int __thiscall MIDIStreamer::FillStopBuffer(MIDIStreamer *this,int buffer_num)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  
  lVar2 = (long)buffer_num;
  iVar4 = 0x79b0;
  lVar1 = 0x18;
  do {
    lVar3 = lVar1;
    *(undefined8 *)((long)this->Events[lVar2 + -1] + lVar3 + 0x5e8) = 0;
    *(int *)((long)this->Events[lVar2 + -1] + lVar3 + 0x5f0) = iVar4 + 0x200;
    *(undefined8 *)((long)this->Events[lVar2 + -1] + lVar3 + 0x5f4) = 0;
    *(int *)((long)this->Events[lVar2 + -1] + lVar3 + 0x5fc) = iVar4;
    iVar4 = iVar4 + 1;
    lVar1 = lVar3 + 0x18;
  } while ((int)(lVar3 + 0x18) != 0x198);
  *(undefined8 *)((long)this->Events[lVar2] + lVar3) = 500;
  *(undefined4 *)((long)this->Events[lVar2] + lVar3 + 8) = 0x2000000;
  this->Buffer[lVar2].lpData = (BYTE *)0x0;
  this->Buffer[lVar2].dwBufferLength = 0;
  this->Buffer[lVar2].dwBytesRecorded = 0;
  this->Buffer[lVar2].lpNext = (MIDIHDR *)0x0;
  this->Buffer[lVar2].lpData = (BYTE *)(this->Events + lVar2);
  this->Buffer[lVar2].dwBufferLength = 0x18c;
  this->Buffer[lVar2].dwBytesRecorded = 0x18c;
  iVar4 = (*this->MIDI->_vptr_MIDIDevice[0xc])();
  if (iVar4 != 0) {
    iVar4 = iVar4 * 4 + 2;
  }
  return iVar4;
}

Assistant:

int MIDIStreamer::FillStopBuffer(int buffer_num)
{
	DWORD *events = Events[buffer_num];
	int i;

	events = WriteStopNotes(events);

	// wait some tics, just so that this buffer takes some time
	events[0] = 500;
	events[1] = 0;
	events[2] = MEVT_NOP << 24;
	events += 3;

	memset(&Buffer[buffer_num], 0, sizeof(MIDIHDR));
	Buffer[buffer_num].lpData = (LPSTR)Events[buffer_num];
	Buffer[buffer_num].dwBufferLength = DWORD((LPSTR)events - Buffer[buffer_num].lpData);
	Buffer[buffer_num].dwBytesRecorded = Buffer[buffer_num].dwBufferLength;
	if (0 != (i = MIDI->PrepareHeader(&Buffer[buffer_num])))
	{
		return SONG_ERROR | (i << 2);
	}
	return SONG_MORE;
}